

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Symbol comment_type(Env *env)

{
  _Bool _Var1;
  int32_t iVar2;
  uint32_t local_1c;
  int32_t c;
  uint32_t i;
  Env *env_local;
  
  local_1c = 2;
  while (iVar2 = peek(env,local_1c), iVar2 == 0x2d) {
    local_1c = local_1c + 1;
  }
  while( true ) {
    _Var1 = not_eof(env);
    if (!_Var1) {
      return COMMENT;
    }
    iVar2 = peek(env,local_1c);
    if ((iVar2 == 0x7c) || (iVar2 == 0x5e)) break;
    _Var1 = is_space_char(iVar2);
    local_1c = local_1c + 1;
    if (!_Var1) {
      return COMMENT;
    }
  }
  return HADDOCK;
}

Assistant:

static Symbol comment_type(Env *env) {
  uint32_t i = 2;
  while (peek(env, i) == '-') i++;
  while (not_eof(env)) {
    int32_t c = peek(env, i++);
    if (c == '|' || c == '^') return HADDOCK;
    else if (!is_space_char(c)) break;
  }
  return COMMENT;
}